

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhsStatus(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,int i,
                 number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newLhs,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *oldLhs)

{
  int iVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  Status *pSVar4;
  pointer pnVar5;
  Real RVar6;
  type_conflict5 tVar7;
  bool bVar8;
  Status SVar9;
  double *pdVar10;
  SPxInternalCodeException *this_00;
  long lVar11;
  long lVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  pointer pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  byte bVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  currRhs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar20 = 0;
  pSVar4 = (this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data;
  pnVar5 = (this->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar14 = (uint *)(pnVar5 + i);
  puVar18 = (uint *)&currRhs;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    *puVar18 = *puVar14;
    puVar14 = puVar14 + 1;
    puVar18 = puVar18 + 1;
  }
  iVar1 = pnVar5[i].m_backend.exp;
  bVar8 = pnVar5[i].m_backend.neg;
  fVar2 = pnVar5[i].m_backend.fpclass;
  iVar3 = pnVar5[i].m_backend.prec_elem;
  currRhs.m_backend.exp = iVar1;
  currRhs.m_backend.neg = bVar8;
  currRhs.m_backend.fpclass = fVar2;
  currRhs.m_backend.prec_elem = iVar3;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_538,0.0,(type *)0x0);
  switch(pSVar4[i]) {
  case D_FREE:
  case D_ON_UPPER:
  case D_ON_LOWER:
  case D_ON_BOTH:
  case D_UNDEFINED:
    if (this->theRep == ROW) {
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      tVar7 = boost::multiprecision::operator>(&this->theShift,(double *)&result_1);
      if (tVar7) {
        forceRecompNonbasicValue(this);
      }
    }
    SVar9 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dualRowStatus(&this->
                             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,i);
    pSVar4[i] = SVar9;
    break;
  case P_FIXED:
    lVar11 = 0x1c;
    pnVar16 = newLhs;
    pnVar19 = &local_230;
    for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = (newLhs->m_backend).exp;
    local_230.m_backend.neg = (newLhs->m_backend).neg;
    local_230.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_230.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pnVar16 = &currRhs;
    pnVar19 = &local_2b0;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = iVar1;
    local_2b0.m_backend.neg = bVar8;
    local_2b0.m_backend.fpclass = fVar2;
    local_2b0.m_backend.prec_elem = iVar3;
    RVar6 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_230,&local_2b0,RVar6);
    if ((bVar8) && (pSVar4[i] = P_ON_UPPER, this->initialized == true)) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    }
    break;
  default:
    this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&result_1,"XCHANG03 This should never happen.",(allocator *)&result);
    SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&result_1);
    __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case P_ON_LOWER:
    pdVar10 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,-*pdVar10,(type *)0x0);
    tVar7 = boost::multiprecision::operator<=(newLhs,&result_1);
    if (tVar7) {
      pdVar10 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_1.m_backend,*pdVar10,(type *)0x0);
      tVar7 = boost::multiprecision::operator>=
                        (&currRhs,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&result_1.m_backend);
      if (tVar7) {
        pSVar4[i] = P_FREE;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar5 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar5 + i;
        pnVar16 = &result;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        result.m_backend.exp = pnVar5[i].m_backend.exp;
        result.m_backend.neg = pnVar5[i].m_backend.neg;
        result.m_backend.fpclass = pnVar5[i].m_backend.fpclass;
        result.m_backend.prec_elem = pnVar5[i].m_backend.prec_elem;
        if (result.m_backend.fpclass != cpp_dec_float_finite ||
            result.m_backend.data._M_elems[0] != 0) {
          result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
        }
        pcVar17 = &result.m_backend;
        pcVar13 = &oldLhs->m_backend;
        goto LAB_003bbe4d;
      }
      pSVar4[i] = P_ON_UPPER;
      if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&currRhs.m_backend);
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 0x1c;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems[6] = 0;
      result_3.m_backend.data._M_elems[7] = 0;
      result_3.m_backend.data._M_elems[8] = 0;
      result_3.m_backend.data._M_elems[9] = 0;
      result_3.m_backend.data._M_elems[10] = 0;
      result_3.m_backend.data._M_elems[0xb] = 0;
      result_3.m_backend.data._M_elems[0xc] = 0;
      result_3.m_backend.data._M_elems[0xd] = 0;
      result_3.m_backend.data._M_elems[0xe] = 0;
      result_3.m_backend.data._M_elems[0xf] = 0;
      result_3.m_backend.data._M_elems[0x10] = 0;
      result_3.m_backend.data._M_elems[0x11] = 0;
      result_3.m_backend.data._M_elems[0x12] = 0;
      result_3.m_backend.data._M_elems[0x13] = 0;
      result_3.m_backend.data._M_elems[0x14] = 0;
      result_3.m_backend.data._M_elems[0x15] = 0;
      result_3.m_backend.data._M_elems[0x16] = 0;
      result_3.m_backend.data._M_elems[0x17] = 0;
      result_3.m_backend.data._M_elems[0x18] = 0;
      result_3.m_backend.data._M_elems[0x19] = 0;
      result_3.m_backend.data._M_elems._104_5_ = 0;
      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_3.m_backend.exp = 0;
      result_3.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_3.m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&oldLhs->m_backend);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&result.m_backend,&result_3.m_backend);
    }
    else {
      lVar11 = 0x1c;
      pnVar16 = newLhs;
      pnVar19 = &local_438;
      for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_438.m_backend.exp = (newLhs->m_backend).exp;
      local_438.m_backend.neg = (newLhs->m_backend).neg;
      local_438.m_backend.fpclass = (newLhs->m_backend).fpclass;
      local_438.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
      pnVar16 = &currRhs;
      pnVar19 = &local_b0;
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_b0.m_backend.exp = iVar1;
      local_b0.m_backend.neg = bVar8;
      local_b0.m_backend.fpclass = fVar2;
      local_b0.m_backend.prec_elem = iVar3;
      RVar6 = Tolerances::epsilon((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._tolerances.
                                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr);
      bVar8 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_438,&local_b0,RVar6);
      if (bVar8) {
        pSVar4[i] = P_FIXED;
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar5 = (this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        if ((this->m_nonbasicValueUpToDate != true) || (this->theRep != COLUMN)) break;
        pnVar5 = (this->theURbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      pcVar17 = &pnVar5[i].m_backend;
      pcVar13 = &result.m_backend;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (pcVar13,&newLhs->m_backend,&oldLhs->m_backend);
LAB_003bbe4d:
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.neg = false;
      result_1.m_backend.exp = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,pcVar17,pcVar13);
    }
    pnVar16 = &result_1;
    pcVar17 = &local_538;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar17->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_538.exp = result_1.m_backend.exp;
    local_538.neg = result_1.m_backend.neg;
    goto LAB_003bbe77;
  case P_ON_UPPER:
    lVar11 = 0x1c;
    pnVar16 = newLhs;
    pnVar19 = &local_130;
    for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_130.m_backend.exp = (newLhs->m_backend).exp;
    local_130.m_backend.neg = (newLhs->m_backend).neg;
    local_130.m_backend.fpclass = (newLhs->m_backend).fpclass;
    local_130.m_backend.prec_elem = (newLhs->m_backend).prec_elem;
    pnVar16 = &currRhs;
    pnVar19 = &local_1b0;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = iVar1;
    local_1b0.m_backend.neg = bVar8;
    local_1b0.m_backend.fpclass = fVar2;
    local_1b0.m_backend.prec_elem = iVar3;
    RVar6 = Tolerances::epsilon((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar8 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_130,&local_1b0,RVar6);
    if (bVar8) {
      pSVar4[i] = P_FIXED;
    }
    break;
  case P_FREE:
    pdVar10 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,-*pdVar10,(type *)0x0);
    tVar7 = boost::multiprecision::operator>
                      (newLhs,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&result_1.m_backend);
    if (((!tVar7) || (pSVar4[i] = P_ON_LOWER, this->m_nonbasicValueUpToDate != true)) ||
       (this->theRep != COLUMN)) break;
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,
               &(this->theURbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&newLhs->m_backend);
    pcVar17 = &result_1.m_backend;
    pcVar13 = &local_538;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar13->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar20 * -8 + 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_538.exp = result_1.m_backend.exp;
    local_538.neg = result_1.m_backend.neg;
LAB_003bbe77:
    local_538.fpclass = result_1.m_backend.fpclass;
    local_538.prec_elem = result_1.m_backend.prec_elem;
    local_538.exp = result_1.m_backend.exp;
    local_538.neg = result_1.m_backend.neg;
  }
  if (this->theRep == COLUMN) {
    pcVar17 = &local_538;
    pnVar16 = &local_330;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pcVar17->data)._M_elems[0];
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar20 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar20 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = local_538.exp;
    local_330.m_backend.neg = local_538.neg;
    local_330.m_backend.fpclass = local_538.fpclass;
    local_330.m_backend.prec_elem = local_538.prec_elem;
    updateNonbasicValue(this,&local_330);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhsStatus(int i, R newLhs, R oldLhs)
{
   typename SPxBasisBase<R>::Desc::Status& stat      = this->desc().rowStatus(i);
   R                    currRhs   = this->rhs(i);
   R                    objChange = 0.0;

   SPxOut::debug(this, "DCHANG03 changeLhsStatus()  : row {}: {}", i, stat);

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER:
      if(newLhs <= R(-infinity))
      {
         if(currRhs >= R(infinity))
         {
            stat = SPxBasisBase<R>::Desc::P_FREE;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = -theURbound[i] * oldLhs;
         }
         else
         {
            stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

            if(m_nonbasicValueUpToDate && rep() == COLUMN)
               objChange = (theLRbound[i] * currRhs) - (theURbound[i] * oldLhs);
         }
      }
      else if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_FIXED;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = this->maxRowObj(i) * (newLhs - oldLhs);
      }
      else if(m_nonbasicValueUpToDate && rep() == COLUMN)
         objChange = theURbound[i] * (newLhs - oldLhs);

      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER:
      if(EQ(newLhs, currRhs, this->tolerances()->epsilon()))
         stat = SPxBasisBase<R>::Desc::P_FIXED;

      break;

   case SPxBasisBase<R>::Desc::P_FREE:
      if(newLhs > R(-infinity))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_LOWER;

         if(m_nonbasicValueUpToDate && rep() == COLUMN)
            objChange = theURbound[i] * newLhs;
      }

      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      if(NE(newLhs, currRhs, this->tolerances()->epsilon()))
      {
         stat = SPxBasisBase<R>::Desc::P_ON_UPPER;

         if(isInitialized())
            theLRbound[i] = this->maxRowObj(i);
      }

      break;

   case SPxBasisBase<R>::Desc::D_FREE:
   case SPxBasisBase<R>::Desc::D_ON_UPPER:
   case SPxBasisBase<R>::Desc::D_ON_LOWER:
   case SPxBasisBase<R>::Desc::D_ON_BOTH:
   case SPxBasisBase<R>::Desc::D_UNDEFINED:
      if(rep() == ROW && theShift > 0.0)
         forceRecompNonbasicValue();

      stat = this->dualRowStatus(i);
      break;

   default:
      throw SPxInternalCodeException("XCHANG03 This should never happen.");
   }

   SPxOut::debug(this, " -> {}\n", stat);

   // we only need to update the nonbasic value in column representation (see nonbasicValue() for comparison/explanation)
   if(rep() == COLUMN)
      updateNonbasicValue(objChange);
}